

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::setSubFocus
          (QGraphicsItemPrivate *this,QGraphicsItem *rootItem,QGraphicsItem *stopItem)

{
  bool bVar1;
  bool bVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItem *pQVar4;
  QGraphicsItemPrivate *pQVar5;
  QGraphicsScenePrivate *pQVar6;
  QGraphicsItemPrivate *in_RSI;
  long in_RDI;
  QGraphicsItem *parent;
  QGraphicsScene *in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  QGraphicsItem *in_stack_ffffffffffffffc0;
  QGraphicsItemPrivate *this_00;
  QGraphicsItemPrivate *local_20;
  
  if (in_RSI == (QGraphicsItemPrivate *)0x0) {
    in_RSI = *(QGraphicsItemPrivate **)(in_RDI + 0x170);
  }
  this_00 = in_RSI;
  pQVar3 = QGraphicsItem::panel
                     ((QGraphicsItem *)
                      CONCAT17(in_stack_ffffffffffffffbf,
                               CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
  pQVar4 = QGraphicsItem::panel
                     ((QGraphicsItem *)
                      CONCAT17(in_stack_ffffffffffffffbf,
                               CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
  local_20 = in_RSI;
  if (pQVar3 == pQVar4) {
    do {
      if ((local_20 != *(QGraphicsItemPrivate **)(in_RDI + 0x170)) &&
         (pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)&local_20->extras), pQVar5->subFocusItem != (QGraphicsItem *)0x0)
         ) {
        pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&local_20->extras);
        if (pQVar5->subFocusItem == *(QGraphicsItem **)(in_RDI + 0x170)) break;
        pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&local_20->extras);
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&pQVar5->subFocusItem->d_ptr);
        clearSubFocus(this_00,pQVar3,in_stack_ffffffffffffffc0);
      }
      in_stack_ffffffffffffffc0 = *(QGraphicsItem **)(in_RDI + 0x170);
      pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&local_20->extras);
      pQVar5->subFocusItem = in_stack_ffffffffffffffc0;
      pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&local_20->extras);
      (*pQVar5->_vptr_QGraphicsItemPrivate[8])();
      bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x975b35);
      bVar2 = false;
      if (!bVar1) {
        pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&local_20->extras);
        local_20 = (QGraphicsItemPrivate *)pQVar5->parent;
        bVar2 = false;
        if ((local_20 != (QGraphicsItemPrivate *)0x0) &&
           (bVar2 = true, (*(ulong *)(in_RDI + 0x160) >> 5 & 1) == 0)) {
          pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)&local_20->extras);
          bVar2 = (*(ulong *)&pQVar5->field_0x160 >> 5 & 1) == 0;
        }
      }
    } while (bVar2);
    if ((*(long *)(in_RDI + 0x88) != 0) &&
       (bVar2 = QGraphicsScene::isActive(in_stack_ffffffffffffffb0), !bVar2)) {
      pQVar3 = *(QGraphicsItem **)(in_RDI + 0x140);
      pQVar6 = QGraphicsScene::d_func((QGraphicsScene *)0x975c06);
      pQVar6->passiveFocusItem = pQVar3;
      pQVar3 = *(QGraphicsItem **)(in_RDI + 0x140);
      pQVar6 = QGraphicsScene::d_func((QGraphicsScene *)0x975c31);
      pQVar6->lastFocusItem = pQVar3;
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setSubFocus(QGraphicsItem *rootItem, QGraphicsItem *stopItem)
{
    // Update focus child chain. Stop at panels, or if this item
    // is hidden, stop at the first item with a visible parent.
    QGraphicsItem *parent = rootItem ? rootItem : q_ptr;
    if (parent->panel() != q_ptr->panel())
        return;

    do {
        // Clear any existing ancestor's subFocusItem.
        if (parent != q_ptr && parent->d_ptr->subFocusItem) {
            if (parent->d_ptr->subFocusItem == q_ptr)
                break;
            parent->d_ptr->subFocusItem->d_ptr->clearSubFocus(nullptr, stopItem);
        }
        parent->d_ptr->subFocusItem = q_ptr;
        parent->d_ptr->subFocusItemChange();
    } while (!parent->isPanel() && (parent = parent->d_ptr->parent) && (visible || !parent->d_ptr->visible));

    if (scene && !scene->isActive()) {
        scene->d_func()->passiveFocusItem = subFocusItem;
        scene->d_func()->lastFocusItem = subFocusItem;
    }
}